

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::quatf>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *result)

{
  pointer *ppqVar1;
  pointer pqVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  char c;
  quatf value;
  float4 v;
  char local_61;
  quatf local_60;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pqVar2 = (result->
           super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar2) {
    (result->super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
    _M_impl.super__Vector_impl_data._M_finish = pqVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)local_50);
    if (bVar5) {
      local_60.real = (float)local_50._0_4_;
      local_60.imag._M_elems[0] = (float)local_50._4_4_;
      local_60.imag._M_elems[1] = (float)local_50._8_8_;
      local_60.imag._M_elems[2] = SUB84(local_50._8_8_,4);
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>::
        _M_realloc_insert<tinyusdz::value::quatf_const&>
                  ((vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>> *)result,
                   iVar3,&local_60);
      }
      else {
        *(ulong *)((iVar3._M_current)->imag)._M_elems =
             CONCAT44(local_60.imag._M_elems[1],local_50._4_4_);
        *(ulong *)(((iVar3._M_current)->imag)._M_elems + 2) =
             CONCAT44(local_50._0_4_,local_60.imag._M_elems[2]);
        ppqVar1 = &(result->
                   super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppqVar1 = *ppqVar1 + 1;
      }
    }
    else {
      local_50._0_8_ = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Not starting with the value of requested type.\n","");
      PushError(this,(string *)local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._0_8_ != &local_40) {
        operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0043cfb1;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,&local_61);
        cVar7 = '\x01';
        if (bVar5) {
          if (local_61 == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,local_50);
              cVar7 = (local_50[0] == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if (local_50[0] != end_symbol && bVar5) goto LAB_0043cefb;
            }
          }
          else {
LAB_0043cefb:
            if (local_61 == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                bVar5 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)local_50);
                if (bVar5) {
                  local_60.real = (float)local_50._0_4_;
                  local_60.imag._M_elems[0] = (float)local_50._4_4_;
                  local_60.imag._M_elems[1] = (float)local_50._8_8_;
                  local_60.imag._M_elems[2] = SUB84(local_50._8_8_,4);
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>::
                    _M_realloc_insert<tinyusdz::value::quatf_const&>
                              ((vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>
                                *)result,iVar3,&local_60);
                  }
                  else {
                    *(ulong *)((iVar3._M_current)->imag)._M_elems =
                         CONCAT44(local_60.imag._M_elems[1],local_50._4_4_);
                    *(ulong *)(((iVar3._M_current)->imag)._M_elems + 2) =
                         CONCAT44(local_50._0_4_,local_60.imag._M_elems[2]);
                    ppqVar1 = &(result->
                               super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppqVar1 = *ppqVar1 + 1;
                  }
                  cVar7 = '\0';
                }
                else {
                  cVar7 = '\x03';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_0043cfb1:
        if ((result->
            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._0_8_ = &local_40;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Empty array.\n","");
        PushError(this,(string *)local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._0_8_ != &local_40) {
          operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}